

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O1

void __thiscall FragmentTest_Empty_Test::~FragmentTest_Empty_Test(FragmentTest_Empty_Test *this)

{
  (this->super_FragmentTest).super_Test._vptr_Test = (_func_int **)&PTR__FragmentTest_0019bcf8;
  std::
  _Rb_tree<unsigned_char_*,_std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>,_std::_Select1st<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>,_std::less<unsigned_char_*>,_std::allocator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_char_*,_std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>,_std::_Select1st<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>,_std::less<unsigned_char_*>,_std::allocator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>_>
               *)&(this->super_FragmentTest).transaction_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F (FragmentTest, Empty) {
    std::vector<std::unique_ptr<section_creation_dispatcher>> c;
    auto extent = fragment::alloc (transaction_, pstore::make_pointee_adaptor (std::begin (c)),
                                   pstore::make_pointee_adaptor (std::end (c)));

    auto f = reinterpret_cast<fragment const *> (extent.addr.absolute ());
    PSTORE_ASSERT (transaction_.get_storage ().begin ()->first ==
                   reinterpret_cast<std::uint8_t const *> (f));
    EXPECT_EQ (0U, f->size ());
}